

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall DomUI::write(DomUI *this,int __fd,void *__buf,size_t __n)

{
  DomWidget *this_00;
  DomLayoutDefault *this_01;
  DomLayoutFunction *this_02;
  DomCustomWidgets *this_03;
  DomTabStops *this_04;
  DomIncludes *this_05;
  DomResources *this_06;
  DomConnections *this_07;
  DomDesignerData *this_08;
  bool bVar1;
  int iVar2;
  undefined4 in_register_00000034;
  QAnyStringView *str_00;
  long in_FS_OFFSET;
  char16_t *str;
  DomUI *in_stack_fffffffffffffa08;
  QArrayDataPointer<char16_t> *in_stack_fffffffffffffa10;
  DomButtonGroups *this_09;
  QString *in_stack_fffffffffffffa18;
  DomSlots *in_stack_fffffffffffffa20;
  QAnyStringView *in_stack_fffffffffffffa28;
  undefined1 local_498 [24];
  undefined1 local_480 [24];
  undefined1 local_468 [24];
  undefined1 local_450 [24];
  undefined1 local_438 [24];
  undefined1 local_420 [24];
  undefined1 local_408 [24];
  undefined1 local_3f0 [24];
  size_t local_3d8;
  QAnyStringView *local_3b0;
  undefined1 local_3a0 [24];
  undefined1 local_388 [24];
  undefined1 local_370 [24];
  size_t local_358;
  QAnyStringView *local_330;
  size_t local_320;
  QAnyStringView *local_2f8;
  size_t local_2e8;
  QAnyStringView *local_2c0;
  size_t local_2b0;
  QAnyStringView *local_288;
  undefined1 local_278 [24];
  size_t local_260;
  QAnyStringView *local_238;
  undefined1 local_228 [24];
  size_t local_210;
  QAnyStringView *local_1e8;
  size_t local_1c0;
  QAnyStringView *local_198;
  size_t local_170;
  QAnyStringView *local_148;
  size_t local_120;
  QAnyStringView *local_f8;
  size_t local_d0;
  QAnyStringView *local_a8;
  size_t local_80;
  QAnyStringView *local_58;
  QArrayDataPointer<char16_t> local_48 [2];
  long local_8;
  
  str_00 = (QAnyStringView *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QString::isEmpty((QString *)0x19fa01);
  if (bVar1) {
    __n = 2;
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_48,(Data *)0x0,L"ui",2);
    QString::QString((QString *)in_stack_fffffffffffffa10,(DataPointer *)in_stack_fffffffffffffa08);
  }
  else {
    QString::toLower(&in_stack_fffffffffffffa08->m_attr_version);
  }
  QAnyStringView::QAnyStringView
            ((QAnyStringView *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
  QXmlStreamWriter::writeStartElement(str_00);
  QString::~QString((QString *)0x19facf);
  if (bVar1) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffa10);
  }
  bVar1 = hasAttributeVersion(this);
  if (bVar1) {
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffa28,(size_t)in_stack_fffffffffffffa20);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
    attributeVersion(in_stack_fffffffffffffa08);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
    QXmlStreamWriter::writeAttribute(str_00,local_58);
    QString::~QString((QString *)0x19fba0);
    QString::~QString((QString *)0x19fbad);
    __n = local_80;
  }
  bVar1 = hasAttributeLanguage(this);
  if (bVar1) {
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffa28,(size_t)in_stack_fffffffffffffa20);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
    attributeLanguage(in_stack_fffffffffffffa08);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
    QXmlStreamWriter::writeAttribute(str_00,local_a8);
    QString::~QString((QString *)0x19fc65);
    QString::~QString((QString *)0x19fc72);
    __n = local_d0;
  }
  bVar1 = hasAttributeDisplayname(this);
  if (bVar1) {
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffa28,(size_t)in_stack_fffffffffffffa20);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
    attributeDisplayname(in_stack_fffffffffffffa08);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
    QXmlStreamWriter::writeAttribute(str_00,local_f8);
    QString::~QString((QString *)0x19fd2a);
    QString::~QString((QString *)0x19fd37);
    __n = local_120;
  }
  bVar1 = hasAttributeIdbasedtr(this);
  if (bVar1) {
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffa28,(size_t)in_stack_fffffffffffffa20);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
    bVar1 = attributeIdbasedtr(this);
    if (bVar1) {
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)in_stack_fffffffffffffa28,(size_t)in_stack_fffffffffffffa20);
    }
    else {
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)in_stack_fffffffffffffa28,(size_t)in_stack_fffffffffffffa20);
    }
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
    QXmlStreamWriter::writeAttribute(str_00,local_148);
    QString::~QString((QString *)0x19fe21);
    QString::~QString((QString *)0x19fe2e);
    __n = local_170;
  }
  bVar1 = hasAttributeConnectslotsbyname(this);
  if (bVar1) {
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffa28,(size_t)in_stack_fffffffffffffa20);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
    bVar1 = attributeConnectslotsbyname(this);
    if (bVar1) {
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)in_stack_fffffffffffffa28,(size_t)in_stack_fffffffffffffa20);
    }
    else {
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)in_stack_fffffffffffffa28,(size_t)in_stack_fffffffffffffa20);
    }
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
    QXmlStreamWriter::writeAttribute(str_00,local_198);
    QString::~QString((QString *)0x19ff18);
    QString::~QString((QString *)0x19ff25);
    __n = local_1c0;
  }
  bVar1 = hasAttributeStdsetdef(this);
  if (bVar1) {
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffa28,(size_t)in_stack_fffffffffffffa20);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
    iVar2 = attributeStdsetdef(this);
    QString::number((int)local_228,iVar2);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
    QXmlStreamWriter::writeAttribute(str_00,local_1e8);
    QString::~QString((QString *)0x19ffe9);
    QString::~QString((QString *)0x19fff6);
    __n = local_210;
  }
  bVar1 = hasAttributeStdSetDef(this);
  if (bVar1) {
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffa28,(size_t)in_stack_fffffffffffffa20);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
    iVar2 = attributeStdSetDef(this);
    QString::number((int)local_278,iVar2);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
    QXmlStreamWriter::writeAttribute(str_00,local_238);
    QString::~QString((QString *)0x1a00ba);
    QString::~QString((QString *)0x1a00c7);
    __n = local_260;
  }
  if ((this->m_children & 1) != 0) {
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffa28,(size_t)in_stack_fffffffffffffa20);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
    QXmlStreamWriter::writeTextElement(str_00,local_288);
    QString::~QString((QString *)0x1a016f);
    __n = local_2b0;
  }
  if ((this->m_children & 2) != 0) {
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffa28,(size_t)in_stack_fffffffffffffa20);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
    QXmlStreamWriter::writeTextElement(str_00,local_2c0);
    QString::~QString((QString *)0x1a021a);
    __n = local_2e8;
  }
  if ((this->m_children & 4) != 0) {
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffa28,(size_t)in_stack_fffffffffffffa20);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
    QXmlStreamWriter::writeTextElement(str_00,local_2f8);
    QString::~QString((QString *)0x1a02c5);
    __n = local_320;
  }
  if ((this->m_children & 8) != 0) {
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffa28,(size_t)in_stack_fffffffffffffa20);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
    QXmlStreamWriter::writeTextElement(str_00,local_330);
    QString::~QString((QString *)0x1a0370);
    __n = local_358;
  }
  if ((this->m_children & 0x10) != 0) {
    this_00 = this->m_widget;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffa28,(size_t)in_stack_fffffffffffffa20);
    DomWidget::write(this_00,__fd,local_370,__n);
    QString::~QString((QString *)0x1a03ed);
  }
  if ((this->m_children & 0x20) != 0) {
    this_01 = this->m_layoutDefault;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffa28,(size_t)in_stack_fffffffffffffa20);
    DomLayoutDefault::write(this_01,__fd,local_388,__n);
    QString::~QString((QString *)0x1a046a);
  }
  if ((this->m_children & 0x40) != 0) {
    this_02 = this->m_layoutFunction;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffa28,(size_t)in_stack_fffffffffffffa20);
    DomLayoutFunction::write(this_02,__fd,local_3a0,__n);
    QString::~QString((QString *)0x1a04e7);
  }
  if ((this->m_children & 0x80) != 0) {
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffa28,(size_t)in_stack_fffffffffffffa20);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
    QAnyStringView::QAnyStringView
              ((QAnyStringView *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
    QXmlStreamWriter::writeTextElement(str_00,local_3b0);
    QString::~QString((QString *)0x1a0594);
    __n = local_3d8;
  }
  if ((this->m_children & 0x100) != 0) {
    this_03 = this->m_customWidgets;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffa28,(size_t)in_stack_fffffffffffffa20);
    DomCustomWidgets::write(this_03,__fd,local_3f0,__n);
    QString::~QString((QString *)0x1a060d);
  }
  if ((this->m_children & 0x200) != 0) {
    this_04 = this->m_tabStops;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffa28,(size_t)in_stack_fffffffffffffa20);
    DomTabStops::write(this_04,__fd,local_408,__n);
    QString::~QString((QString *)0x1a0680);
  }
  if ((this->m_children & 0x400) != 0) {
    this_05 = this->m_includes;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffa28,(size_t)in_stack_fffffffffffffa20);
    DomIncludes::write(this_05,__fd,local_420,__n);
    QString::~QString((QString *)0x1a06f3);
  }
  if ((this->m_children & 0x800) != 0) {
    this_06 = this->m_resources;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffa28,(size_t)in_stack_fffffffffffffa20);
    DomResources::write(this_06,__fd,local_438,__n);
    QString::~QString((QString *)0x1a0766);
  }
  if ((this->m_children & 0x1000) != 0) {
    this_07 = this->m_connections;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffa28,(size_t)in_stack_fffffffffffffa20);
    DomConnections::write(this_07,__fd,local_450,__n);
    QString::~QString((QString *)0x1a07d9);
  }
  if ((this->m_children & 0x2000) != 0) {
    this_08 = this->m_designerdata;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffa28,(size_t)in_stack_fffffffffffffa20);
    DomDesignerData::write(this_08,__fd,local_468,__n);
    QString::~QString((QString *)0x1a084c);
  }
  if ((this->m_children & 0x4000) != 0) {
    in_stack_fffffffffffffa20 = this->m_slots;
    in_stack_fffffffffffffa28 = str_00;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)str_00,(size_t)in_stack_fffffffffffffa20);
    DomSlots::write(in_stack_fffffffffffffa20,(int)in_stack_fffffffffffffa28,local_480,__n);
    QString::~QString((QString *)0x1a08bf);
  }
  if ((this->m_children & 0x8000) != 0) {
    this_09 = this->m_buttonGroups;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffa28,(size_t)in_stack_fffffffffffffa20);
    DomButtonGroups::write(this_09,(int)str_00,local_498,__n);
    QString::~QString((QString *)0x1a0932);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomUI::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("ui") : tagName.toLower());

    if (hasAttributeVersion())
        writer.writeAttribute(u"version"_s, attributeVersion());

    if (hasAttributeLanguage())
        writer.writeAttribute(u"language"_s, attributeLanguage());

    if (hasAttributeDisplayname())
        writer.writeAttribute(u"displayname"_s, attributeDisplayname());

    if (hasAttributeIdbasedtr())
        writer.writeAttribute(u"idbasedtr"_s, (attributeIdbasedtr() ? u"true"_s : u"false"_s));

    if (hasAttributeConnectslotsbyname())
        writer.writeAttribute(u"connectslotsbyname"_s, (attributeConnectslotsbyname() ? u"true"_s : u"false"_s));

    if (hasAttributeStdsetdef())
        writer.writeAttribute(u"stdsetdef"_s, QString::number(attributeStdsetdef()));

    if (hasAttributeStdSetDef())
        writer.writeAttribute(u"stdsetdef"_s, QString::number(attributeStdSetDef()));

    if (m_children & Author)
        writer.writeTextElement(u"author"_s, m_author);

    if (m_children & Comment)
        writer.writeTextElement(u"comment"_s, m_comment);

    if (m_children & ExportMacro)
        writer.writeTextElement(u"exportmacro"_s, m_exportMacro);

    if (m_children & Class)
        writer.writeTextElement(u"class"_s, m_class);

    if (m_children & Widget)
        m_widget->write(writer, u"widget"_s);

    if (m_children & LayoutDefault)
        m_layoutDefault->write(writer, u"layoutdefault"_s);

    if (m_children & LayoutFunction)
        m_layoutFunction->write(writer, u"layoutfunction"_s);

    if (m_children & PixmapFunction)
        writer.writeTextElement(u"pixmapfunction"_s, m_pixmapFunction);

    if (m_children & CustomWidgets)
        m_customWidgets->write(writer, u"customwidgets"_s);

    if (m_children & TabStops)
        m_tabStops->write(writer, u"tabstops"_s);

    if (m_children & Includes)
        m_includes->write(writer, u"includes"_s);

    if (m_children & Resources)
        m_resources->write(writer, u"resources"_s);

    if (m_children & Connections)
        m_connections->write(writer, u"connections"_s);

    if (m_children & Designerdata)
        m_designerdata->write(writer, u"designerdata"_s);

    if (m_children & Slots)
        m_slots->write(writer, u"slots"_s);

    if (m_children & ButtonGroups)
        m_buttonGroups->write(writer, u"buttongroups"_s);

    writer.writeEndElement();
}